

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-utils.h
# Opt level: O0

double cptp_dist(Instance *instance,int32_t i,int32_t j)

{
  double *pdVar1;
  int64_t iVar2;
  double distance;
  int32_t j_local;
  int32_t i_local;
  Instance *instance_local;
  
  if ((i < 0) || (instance->num_customers + 1 <= i)) {
    __assert_fail("i >= 0 && i < instance->num_customers + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                  ,0x3d,"double cptp_dist(const Instance *, int32_t, int32_t)");
  }
  if ((-1 < j) && (j < instance->num_customers + 1)) {
    if (instance->edge_weight == (double *)0x0) {
      instance_local = (Instance *)vec2d_dist(instance->positions + i,instance->positions + j);
      switch(instance->rounding_strat) {
      case CPTP_DIST_ROUND:
        instance_local = (Instance *)round((double)instance_local);
        break;
      case CPTP_DIST_NO_ROUND:
        break;
      case CPTP_DIST_CEIL:
        instance_local = (Instance *)ceil((double)instance_local);
        break;
      case CPTP_DIST_FLOOR:
        instance_local = (Instance *)floor((double)instance_local);
        break;
      default:
        __assert_fail("!\"Invalid code path!\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                      ,0x50,"double cptp_dist(const Instance *, int32_t, int32_t)");
      }
    }
    else {
      pdVar1 = instance->edge_weight;
      iVar2 = sxpos(instance->num_customers + 1,i,j);
      instance_local = (Instance *)pdVar1[iVar2];
    }
    return (double)instance_local;
  }
  __assert_fail("j >= 0 && j < instance->num_customers + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                ,0x3e,"double cptp_dist(const Instance *, int32_t, int32_t)");
}

Assistant:

static inline double cptp_dist(const Instance *instance, int32_t i, int32_t j) {
    assert(i >= 0 && i < instance->num_customers + 1);
    assert(j >= 0 && j < instance->num_customers + 1);

    if (instance->edge_weight) {
        return instance->edge_weight[sxpos(instance->num_customers + 1, i, j)];
    } else {
        double distance =
            vec2d_dist(&instance->positions[i], &instance->positions[j]);

        switch (instance->rounding_strat) {
        case CPTP_DIST_ROUND: /// Default
            return round(distance);
        case CPTP_DIST_NO_ROUND:
            return distance;
        case CPTP_DIST_CEIL:
            return ceil(distance);
        case CPTP_DIST_FLOOR:
            return floor(distance);
        default:
            assert(!"Invalid code path!");
            return INFINITY;
        }
    }
    return INFINITY;
}